

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleTimeZone::getOffset
          (SimpleTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,uint8_t dayOfWeek
          ,int32_t millis,int32_t monthLength,int32_t prevMonthLength,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int local_84;
  int local_80;
  int32_t local_70;
  int local_54;
  int32_t endCompare;
  int32_t startCompare;
  UBool southern;
  int32_t result;
  uint8_t dayOfWeek_local;
  int32_t day_local;
  int32_t month_local;
  int32_t year_local;
  uint8_t era_local;
  SimpleTimeZone *this_local;
  
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    if ((((((era == '\x01') || (era == '\0')) && (-1 < month)) &&
         (((month < 0xc && (0 < day)) &&
          ((day <= monthLength && ((dayOfWeek != '\0' && (dayOfWeek < 8)))))))) && (-1 < millis)) &&
       ((((millis < 86400000 && (0x1b < monthLength)) && (monthLength < 0x20)) &&
        ((0x1b < prevMonthLength && (prevMonthLength < 0x20)))))) {
      startCompare = this->rawOffset;
      this_local._4_4_ = startCompare;
      if (((this->useDaylight != '\0') && (this->startYear <= year)) && (era == '\x01')) {
        bVar1 = this->endMonth < this->startMonth;
        if (this->startTimeMode == UTC_TIME) {
          local_70 = -this->rawOffset;
        }
        else {
          local_70 = 0;
        }
        iVar3 = compareToRule((int8_t)month,(int8_t)monthLength,(int8_t)prevMonthLength,(int8_t)day,
                              dayOfWeek,millis,local_70,this->startMode,this->startMonth,
                              this->startDayOfWeek,this->startDay,this->startTime);
        local_54 = 0;
        if (bVar1 != -1 < iVar3) {
          if (this->endTimeMode == WALL_TIME) {
            local_80 = this->dstSavings;
          }
          else {
            if (this->endTimeMode == UTC_TIME) {
              local_84 = -this->rawOffset;
            }
            else {
              local_84 = 0;
            }
            local_80 = local_84;
          }
          local_54 = compareToRule((int8_t)month,(int8_t)monthLength,(int8_t)prevMonthLength,
                                   (int8_t)day,dayOfWeek,millis,local_80,this->endMode,
                                   this->endMonth,this->endDayOfWeek,this->endDay,this->endTime);
        }
        if ((((!bVar1) && (-1 < iVar3)) && (local_54 < 0)) ||
           ((bVar1 && ((-1 < iVar3 || (local_54 < 0)))))) {
          startCompare = this->dstSavings + startCompare;
        }
        this_local._4_4_ = startCompare;
      }
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t 
SimpleTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                          uint8_t dayOfWeek, int32_t millis, 
                          int32_t monthLength, int32_t prevMonthLength,
                          UErrorCode& status) const
{
    if(U_FAILURE(status)) return 0;

    if ((era != GregorianCalendar::AD && era != GregorianCalendar::BC)
        || month < UCAL_JANUARY
        || month > UCAL_DECEMBER
        || day < 1
        || day > monthLength
        || dayOfWeek < UCAL_SUNDAY
        || dayOfWeek > UCAL_SATURDAY
        || millis < 0
        || millis >= U_MILLIS_PER_DAY
        || monthLength < 28
        || monthLength > 31
        || prevMonthLength < 28
        || prevMonthLength > 31) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }

    int32_t result = rawOffset;

    // Bail out if we are before the onset of daylight savings time
    if(!useDaylight || year < startYear || era != GregorianCalendar::AD) 
        return result;

    // Check for southern hemisphere.  We assume that the start and end
    // month are different.
    UBool southern = (startMonth > endMonth);

    // Compare the date to the starting and ending rules.+1 = date>rule, -1
    // = date<rule, 0 = date==rule.
    int32_t startCompare = compareToRule((int8_t)month, (int8_t)monthLength, (int8_t)prevMonthLength,
                                         (int8_t)day, (int8_t)dayOfWeek, millis,
                                         startTimeMode == UTC_TIME ? -rawOffset : 0,
                                         startMode, (int8_t)startMonth, (int8_t)startDayOfWeek,
                                         (int8_t)startDay, startTime);
    int32_t endCompare = 0;

    /* We don't always have to compute endCompare.  For many instances,
     * startCompare is enough to determine if we are in DST or not.  In the
     * northern hemisphere, if we are before the start rule, we can't have
     * DST.  In the southern hemisphere, if we are after the start rule, we
     * must have DST.  This is reflected in the way the next if statement
     * (not the one immediately following) short circuits. */
    if(southern != (startCompare >= 0)) {
        endCompare = compareToRule((int8_t)month, (int8_t)monthLength, (int8_t)prevMonthLength,
                                   (int8_t)day, (int8_t)dayOfWeek, millis,
                                   endTimeMode == WALL_TIME ? dstSavings :
                                    (endTimeMode == UTC_TIME ? -rawOffset : 0),
                                   endMode, (int8_t)endMonth, (int8_t)endDayOfWeek,
                                   (int8_t)endDay, endTime);
    }

    // Check for both the northern and southern hemisphere cases.  We
    // assume that in the northern hemisphere, the start rule is before the
    // end rule within the calendar year, and vice versa for the southern
    // hemisphere.
    if ((!southern && (startCompare >= 0 && endCompare < 0)) ||
        (southern && (startCompare >= 0 || endCompare < 0)))
        result += dstSavings;

    return result;
}